

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int i;
  long lVar1;
  long lVar2;
  
  GenerateMetadataFile(file,is_descriptor,generator_context);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x58); lVar1 = lVar1 + 1) {
    GenerateMessageFile(file,(Descriptor *)(*(long *)(file + 0x60) + lVar2),is_descriptor,
                        generator_context);
    lVar2 = lVar2 + 0xa8;
  }
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x68); lVar1 = lVar1 + 1) {
    GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar2),is_descriptor,
                     generator_context);
    lVar2 = lVar2 + 0x38;
  }
  return;
}

Assistant:

void GenerateFile(const FileDescriptor* file, bool is_descriptor,
                  GeneratorContext* generator_context) {
  GenerateMetadataFile(file, is_descriptor, generator_context);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageFile(file, file->message_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumFile(file, file->enum_type(i), is_descriptor,
                     generator_context);
  }
}